

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::EqualityExpressionNode::BuildProgram
          (EqualityExpressionNode *this,Scope *scope,ostream *out)

{
  int iVar1;
  const_reference pvVar2;
  pointer pAVar3;
  size_type sVar4;
  ostream *poVar5;
  char *local_48;
  ulong local_28;
  size_t i;
  ostream *out_local;
  Scope *scope_local;
  EqualityExpressionNode *this_local;
  
  pvVar2 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar2);
  (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
  local_28 = 2;
  while( true ) {
    sVar4 = std::
            vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
            ::size(&(this->super_ASTNodeBasic).children_);
    if (sVar4 <= local_28) break;
    pvVar2 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,local_28);
    pAVar3 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(pvVar2);
    (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
    poVar5 = std::operator<<(out,"    ");
    pvVar2 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,local_28 - 1);
    pAVar3 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(pvVar2);
    iVar1 = (*pAVar3->_vptr_ASTNodeBasic[2])();
    if (iVar1 == 0x4a) {
      local_48 = "ceq";
    }
    else {
      local_48 = "cne";
    }
    poVar5 = std::operator<<(poVar5,local_48);
    std::operator<<(poVar5,"\n");
    vpl::Scope::Pop(scope);
    local_28 = local_28 + 2;
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 2; i < children_.size(); i += 2) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    " << (children_[i - 1]->GetType() == kEqualOpType ? "ceq" : "cne") << "\n";
                    scope->Pop();
                }
            }